

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg-queue.c
# Opt level: O1

ndn_msg * ndn_msgqueue_post(void *target,ndn_msg_callback reason,size_t param_length,void *param)

{
  ulong uVar1;
  ndn_msg_t *pnVar2;
  ulong uVar3;
  ndn_msg_t *pnVar4;
  
  uVar1 = param_length + 0x18;
  ndn_msgqueue_empty();
  uVar3 = (long)&psplit - (long)ptail;
  if (ptail < pfront) {
    uVar3 = (long)&pfront->obj + ~(ulong)ptail;
  }
  if ((pfront < ptail) && (uVar3 < param_length + 0x30)) {
    if (uVar3 < 0x18 || (long)&pfront[-0xd0a3].func <= (long)(int)uVar1) {
      return (ndn_msg *)0x0;
    }
    ptail->func = (ndn_msg_callback)0xffffffffffffffff;
    ptail->length = uVar3;
    ptail = (ndn_msg_t *)msg_queue;
  }
  else {
    if (uVar3 < uVar1) {
      return (ndn_msg *)0x0;
    }
    if (pfront == (ndn_msg_t *)msg_queue && uVar3 == uVar1) {
      return (ndn_msg *)0x0;
    }
  }
  pnVar2 = ptail;
  ptail->obj = target;
  pnVar2->func = reason;
  pnVar2->length = uVar1;
  if (param_length != 0) {
    memcpy(pnVar2 + 1,param,param_length);
  }
  pnVar4 = (ndn_msg_t *)((long)&pnVar2->obj + pnVar2->length);
  ptail = (ndn_msg_t *)msg_queue;
  if (pnVar4 < &psplit) {
    ptail = pnVar4;
  }
  return pnVar2;
}

Assistant:

struct ndn_msg*
ndn_msgqueue_post(void *target,
                  ndn_msg_callback reason,
                  size_t param_length,
                  void *param)
{
  size_t len = param_length + sizeof(ndn_msg_t);
  size_t space;
  ndn_msg_t* ret;

  // defrag the memory
  ndn_msgqueue_empty();

  if(pfront > ptail) {
    // -1 is to prevent (ptail == pfront) after call
    space = ((uint8_t*)pfront) - ((uint8_t*)ptail) - 1;
  } else {
    space = (&msg_queue[NDN_MSGQUEUE_SIZE] - ((uint8_t*)ptail));
  }

  // After tail?
  if(pfront >= ptail || space >= len + sizeof(ndn_msg_t)){
    // No-padding (= is to prevent ptail == pfront after call)
    if(space < len || (space == len && pfront == (ndn_msg_t*)&msg_queue))
      return NULL;
  } else {
    // Padding & rewind (= is to prevent ptail == pfront after call)
    if(((uint8_t*)pfront) - &msg_queue[0] <= (int) len)
      return NULL;

    if(space >= sizeof(ndn_msg_t)){
      ptail->func = NDN_MSG_PADDING;
      ptail->length = space;
      ptail = (ndn_msg_t*)&msg_queue[0];
    }else{
      // This should never happen
      return NULL;
    }
  }

  ptail->obj = target;
  ptail->func = reason;
  ptail->length = len;
  if(param_length > 0){
    memcpy(ptail->param, param, param_length);
  }

  ret = ptail;
  MSGQUEUE_NEXT(ptail);

  return ret;
}